

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_deflate(Byte *compr,uLong comprLen)

{
  uint uVar1;
  size_t sVar2;
  uLong len;
  char *pcStack_88;
  int err;
  z_stream c_stream;
  uLong comprLen_local;
  Byte *compr_local;
  
  c_stream.reserved = comprLen;
  sVar2 = strlen(hello);
  c_stream.state = (internal_state *)zalloc;
  c_stream.zalloc = (alloc_func)zfree;
  c_stream.zfree = (free_func)0x0;
  uVar1 = deflateInit_(&stack0xffffffffffffff78,0xffffffff,"1.2.8",0x70);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","deflateInit",(ulong)uVar1);
    exit(1);
  }
  pcStack_88 = hello;
  c_stream.total_in = (uLong)compr;
  do {
    if (c_stream._8_8_ == sVar2 + 1 || c_stream.reserved <= (ulong)c_stream._32_8_) {
      do {
        c_stream.next_out._0_4_ = 1;
        uVar1 = deflate(&stack0xffffffffffffff78,4);
        if (uVar1 == 1) {
          uVar1 = deflateEnd(&stack0xffffffffffffff78);
          if (uVar1 != 0) {
            fprintf(_stderr,"%s error: %d\n","deflateEnd",(ulong)uVar1);
            exit(1);
          }
          return;
        }
      } while (uVar1 == 0);
      fprintf(_stderr,"%s error: %d\n","deflate",(ulong)uVar1);
      exit(1);
    }
    c_stream.next_out._0_4_ = 1;
    c_stream.next_in._0_4_ = 1;
    uVar1 = deflate(&stack0xffffffffffffff78,0);
  } while (uVar1 == 0);
  fprintf(_stderr,"%s error: %d\n","deflate",(ulong)uVar1);
  exit(1);
}

Assistant:

void test_deflate(compr, comprLen)
    Byte *compr;
    uLong comprLen;
{
    z_stream c_stream; /* compression stream */
    int err;
    uLong len = (uLong)strlen(hello)+1;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_DEFAULT_COMPRESSION);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_in  = (z_const unsigned char *)hello;
    c_stream.next_out = compr;

    while (c_stream.total_in != len && c_stream.total_out < comprLen) {
        c_stream.avail_in = c_stream.avail_out = 1; /* force small buffers */
        err = deflate(&c_stream, Z_NO_FLUSH);
        CHECK_ERR(err, "deflate");
    }
    /* Finish the stream, still forcing small buffers: */
    for (;;) {
        c_stream.avail_out = 1;
        err = deflate(&c_stream, Z_FINISH);
        if (err == Z_STREAM_END) break;
        CHECK_ERR(err, "deflate");
    }

    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}